

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O2

int si9ma::DP::save_money_dp(int *arr,int length,int index,int target)

{
  bool bVar1;
  ulong uVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  int iVar4;
  ulong uVar5;
  undefined4 *puVar6;
  size_t __n;
  undefined4 *__s;
  undefined4 *__s_00;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  uint local_34;
  
  local_40 = CONCAT44(in_register_0000000c,target);
  iVar4 = 0;
  if (index < length) {
    local_48 = (undefined1 *)&local_48;
    if ((arr != (int *)0x0) && (iVar4 = 0, -1 < index)) {
      uVar2 = (ulong)(target + 1) * 4 + 0xf & 0xfffffffffffffff0;
      __s = (undefined4 *)((long)&local_48 - uVar2);
      __s_00 = (undefined4 *)((long)__s - uVar2);
      __n = (ulong)(target + 1) << 2;
      bVar1 = false;
      local_34 = length;
      *(undefined8 *)(__s_00 + -2) = 0x10c5d8;
      memset(__s,0,__n);
      *(undefined8 *)(__s_00 + -2) = 0x10c5e5;
      memset(__s_00,0,__n);
      *__s = 1;
      uVar2 = (ulong)local_34;
      while (0 < (int)uVar2) {
        uVar2 = uVar2 - 1;
        for (lVar3 = 0; lVar3 <= (int)local_40; lVar3 = lVar3 + 1) {
          uVar5 = (ulong)(uint)-arr[uVar2] + lVar3;
          if (bVar1) {
            if ((int)uVar5 < 0) {
              iVar4 = 0;
            }
            else {
              iVar4 = __s[uVar5 & 0xffffffff];
            }
            iVar4 = iVar4 + __s_00[lVar3];
            puVar6 = __s;
          }
          else {
            if ((int)uVar5 < 0) {
              iVar4 = 0;
            }
            else {
              iVar4 = __s_00[uVar5 & 0xffffffff];
            }
            iVar4 = iVar4 + __s[lVar3];
            puVar6 = __s_00;
          }
          puVar6[lVar3] = iVar4;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (bVar1) {
        __s = __s_00;
      }
      iVar4 = __s[(int)local_40];
    }
  }
  return iVar4;
}

Assistant:

int DP::save_money_dp(int *arr, int length, int index, int target) {
        if (arr == nullptr || index < 0 || index >= length)
            return 0;

        int res_arr1[target + 1];
        int res_arr2[target + 1];
        memset(res_arr1,0, sizeof(res_arr1));
        memset(res_arr2,0, sizeof(res_arr2));
        bool is_first_main = false;
        res_arr1[0] = 1;

        for (int i = length - 1 ; i >= 0 ; --i) {
            for (int j = 0; j <= target; ++j) {
                if (is_first_main)
                    res_arr1[j] = res_arr2[j] + (j - arr[i] < 0 ? 0 : res_arr1[j - arr[i]]);
                else
                    res_arr2[j] = res_arr1[j] + (j - arr[i] < 0 ? 0:  res_arr2[j - arr[i]]);
            }

            is_first_main = !is_first_main;
        }

        return is_first_main ? res_arr2[target] : res_arr1[target];
    }